

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleDynamicsWorld.cpp
# Opt level: O2

void __thiscall btSimpleDynamicsWorld::synchronizeMotionStates(btSimpleDynamicsWorld *this)

{
  btCollisionObject *pbVar1;
  btCollisionShape *pbVar2;
  int i;
  long lVar3;
  
  for (lVar3 = 0;
      lVar3 < (this->super_btDynamicsWorld).super_btCollisionWorld.m_collisionObjects.m_size;
      lVar3 = lVar3 + 1) {
    pbVar1 = (this->super_btDynamicsWorld).super_btCollisionWorld.m_collisionObjects.m_data[lVar3];
    if ((((pbVar1 != (btCollisionObject *)0x0) && ((pbVar1->m_internalType & 2U) != 0)) &&
        (pbVar2 = pbVar1[1].m_rootCollisionShape, pbVar2 != (btCollisionShape *)0x0)) &&
       (pbVar1->m_activationState1 != 2)) {
      (*pbVar2->_vptr_btCollisionShape[3])(pbVar2,&pbVar1->m_worldTransform);
    }
  }
  return;
}

Assistant:

void	btSimpleDynamicsWorld::synchronizeMotionStates()
{
	///@todo: iterate over awake simulation islands!
	for ( int i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* colObj = m_collisionObjects[i];
		btRigidBody* body = btRigidBody::upcast(colObj);
		if (body && body->getMotionState())
		{
			if (body->getActivationState() != ISLAND_SLEEPING)
			{
				body->getMotionState()->setWorldTransform(body->getWorldTransform());
			}
		}
	}

}